

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O1

void __thiscall CgroupController::enter(CgroupController *this)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  ContextManager *pCVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  string to_write;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string local_50;
  
  if (this->enter_fd_ == -1) {
    pCVar3 = ContextManager::get();
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Cgroup enter was not delayed","");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  uVar2 = getpid();
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0011c37d;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0011c37d;
      }
      if (uVar5 < 10000) goto LAB_0011c37d;
      uVar6 = uVar6 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0011c37d:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_70),__len,__val);
  sVar4 = ::write(this->enter_fd_,local_70,local_68);
  if (((int)(uint)sVar4 < 0) || (((uint)sVar4 & 0x7fffffff) != local_68)) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_50,"Cannot write to cgroups tasks file: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  close_enter_fd(this);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void CgroupController::enter() {
    if (enter_fd_ == -1) {
        die("Cgroup enter was not delayed");
    }
    std::string to_write = std::to_string(getpid());
    int cnt = ::write(enter_fd_, to_write.c_str(), to_write.size());
    if (cnt < 0 || static_cast<size_t>(cnt) != to_write.size()) {
        die(format("Cannot write to cgroups tasks file: %m"));
    }
    close_enter_fd();
}